

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall bsplib::Rdma::PushPopCommBuf::serialize(PushPopCommBuf *this,A2A *a2a)

{
  unsigned_long x;
  int iVar1;
  size_type sVar2;
  ssize_t sVar3;
  reference pvVar4;
  reference pvVar5;
  size_t __n;
  size_t __n_00;
  int in_R8D;
  Memslot slotid;
  size_t s_1;
  int p_1;
  int n_nbuf_1;
  Buffer nbuf_1;
  size_t id;
  size_t size;
  size_t addr;
  char *null;
  PushEntry entry;
  size_t s;
  int p;
  int n_nbuf;
  Buffer nbuf;
  size_t n_popped_slots;
  size_t n_pushed_slots;
  A2A *a2a_local;
  PushPopCommBuf *this_local;
  
  sVar2 = std::
          vector<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
          ::size(&this->m_pushed_slots);
  nbuf._2_8_ = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         (&this->m_popped_slots);
  sVar3 = UIntSerialize<unsigned_long>::write((int)sVar2,(void *)((long)&p + 2),__n);
  s._4_4_ = 0;
  while( true ) {
    iVar1 = A2A::nprocs(a2a);
    if (iVar1 <= s._4_4_) break;
    A2A::send(a2a,s._4_4_,(void *)((long)&p + 2),(long)(int)sVar3,in_R8D);
    entry.slot = 0;
    while( true ) {
      sVar2 = std::
              vector<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
              ::size(&this->m_pushed_slots);
      if (sVar2 <= entry.slot) break;
      pvVar4 = std::
               vector<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
               ::operator[](&this->m_pushed_slots,entry.slot);
      x = (pvVar4->block).size;
      nbuf_1._2_8_ = pvVar4->slot;
      serial<unsigned_long>(a2a,s._4_4_,(unsigned_long)(pvVar4->block).addr);
      serial<unsigned_long>(a2a,s._4_4_,x);
      serial<unsigned_long>(a2a,s._4_4_,nbuf_1._2_8_);
      entry.slot = entry.slot + 1;
    }
    s._4_4_ = s._4_4_ + 1;
  }
  sVar3 = UIntSerialize<unsigned_long>::write((int)nbuf._2_8_,(void *)((long)&p_1 + 2),__n_00);
  s_1._4_4_ = 0;
  while( true ) {
    iVar1 = A2A::nprocs(a2a);
    if (iVar1 <= s_1._4_4_) break;
    A2A::send(a2a,s_1._4_4_,(void *)((long)&p_1 + 2),(long)(int)sVar3,in_R8D);
    slotid = 0;
    while( true ) {
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (&this->m_popped_slots);
      if (sVar2 <= slotid) break;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_popped_slots,slotid);
      serial<unsigned_long>(a2a,s_1._4_4_,*pvVar5);
      slotid = slotid + 1;
    }
    s_1._4_4_ = s_1._4_4_ + 1;
  }
  return;
}

Assistant:

void Rdma::PushPopCommBuf::serialize( A2A & a2a ) 
{
    typedef UIntSerialize< size_t >    SizeSer;

    const size_t n_pushed_slots = m_pushed_slots.size();
    const size_t n_popped_slots = m_popped_slots.size();

    // broadcast pushed slots
    { SizeSer::Buffer nbuf;
      const int n_nbuf = SizeSer::write( n_pushed_slots, nbuf );
      for (int p = 0; p < a2a.nprocs(); ++p) {
        a2a.send( p, nbuf, n_nbuf );

        for (size_t s = 0; s < m_pushed_slots.size(); ++s) {
            PushEntry entry = m_pushed_slots[s];
            char * null = NULL;
            size_t addr = static_cast<char *>(entry.block.addr) - null;
            size_t size = entry.block.size;
            size_t id = entry.slot;
            
            serial( a2a, p, addr );
            serial( a2a, p, size );
            serial( a2a, p, id );
        }
    } }

    // broadcast popped slots
    { SizeSer::Buffer nbuf;
      const int n_nbuf = SizeSer::write( n_popped_slots, nbuf );
      for (int p = 0; p < a2a.nprocs(); ++p) {
        a2a.send( p, nbuf, n_nbuf );

        for (size_t s = 0; s < m_popped_slots.size(); ++s) {
            Memslot slotid = m_popped_slots[s];
            serial( a2a, p, slotid );
        }
    } }
}